

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

bool __thiscall Json::Value::removeIndex(Value *this,ArrayIndex index,Value *removed)

{
  bool bVar1;
  iterator __position;
  ArrayIndex in_ESI;
  Value *in_RDI;
  iterator itLast;
  CZString keyLast;
  CZString key_1;
  ArrayIndex i;
  ArrayIndex oldSize;
  iterator it;
  CZString key;
  ArrayIndex in_stack_00000154;
  Value *in_stack_00000158;
  Value *in_stack_fffffffffffffed8;
  iterator in_stack_fffffffffffffee0;
  Value *in_stack_fffffffffffffef8;
  key_type *in_stack_ffffffffffffff18;
  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *in_stack_ffffffffffffff20;
  CZString local_d0 [2];
  Value *in_stack_ffffffffffffff58;
  Value *in_stack_ffffffffffffff60;
  CZString local_98;
  ArrayIndex local_88;
  ArrayIndex local_84;
  undefined4 local_54;
  _Self local_50 [3];
  _Self local_38;
  CZString local_30;
  ArrayIndex local_14;
  byte local_1;
  
  if ((*(ushort *)&in_RDI->field_0x8 & 0xff) == 6) {
    local_14 = in_ESI;
    CZString::CZString(&local_30,in_ESI);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
         ::find((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                 *)in_stack_fffffffffffffed8,(key_type *)0x15be63);
    local_50[0]._M_node =
         (_Base_ptr)
         std::
         map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
         ::end((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                *)in_stack_fffffffffffffed8);
    bVar1 = std::operator==(&local_38,local_50);
    if (bVar1) {
      local_1 = 0;
      local_54 = 1;
    }
    else {
      std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> *)0x15bee5
                );
      Value(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      operator=((Value *)in_stack_fffffffffffffee0._M_node,in_stack_fffffffffffffed8);
      ~Value(in_RDI);
      local_84 = size(in_stack_fffffffffffffef8);
      for (local_88 = local_14; local_88 < local_84 - 1; local_88 = local_88 + 1) {
        CZString::CZString(&local_98,local_88);
        operator[](in_stack_00000158,in_stack_00000154);
        Value(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        std::
        map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
        ::operator[](in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        operator=((Value *)in_stack_fffffffffffffee0._M_node,in_stack_fffffffffffffed8);
        ~Value(in_RDI);
        CZString::~CZString((CZString *)in_stack_fffffffffffffee0._M_node);
      }
      CZString::CZString(local_d0,local_84 - 1);
      __position = std::
                   map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                   ::find((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                           *)in_stack_fffffffffffffed8,(key_type *)0x15c085);
      in_stack_fffffffffffffee0 =
           std::
           map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
           ::erase_abi_cxx11_(in_stack_fffffffffffffee0._M_node,__position);
      local_1 = 1;
      local_54 = 1;
      CZString::~CZString((CZString *)in_stack_fffffffffffffee0._M_node);
    }
    CZString::~CZString((CZString *)in_stack_fffffffffffffee0._M_node);
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool Value::removeIndex(ArrayIndex index, Value* removed) {
  if (type_ != arrayValue) {
    return false;
  }
  CZString key(index);
  ObjectValues::iterator it = value_.map_->find(key);
  if (it == value_.map_->end()) {
    return false;
  }
  *removed = it->second;
  ArrayIndex oldSize = size();
  // shift left all items left, into the place of the "removed"
  for (ArrayIndex i = index; i < (oldSize - 1); ++i){
    CZString key(i);
    (*value_.map_)[key] = (*this)[i + 1];
  }
  // erase the last one ("leftover")
  CZString keyLast(oldSize - 1);
  ObjectValues::iterator itLast = value_.map_->find(keyLast);
  value_.map_->erase(itLast);
  return true;
}